

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

InstanceConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceConfigRuleSyntax,slang::syntax::InstanceConfigRuleSyntax_const&>
          (BumpAllocator *this,InstanceConfigRuleSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  InstanceConfigRuleSyntax *pIVar13;
  
  pIVar13 = (InstanceConfigRuleSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((InstanceConfigRuleSyntax *)this->endPtr < pIVar13 + 1) {
    pIVar13 = (InstanceConfigRuleSyntax *)allocateSlow(this,0x88,8);
  }
  else {
    this->head->current = (byte *)(pIVar13 + 1);
  }
  (pIVar13->super_ConfigRuleSyntax).super_SyntaxNode.previewNode =
       (args->super_ConfigRuleSyntax).super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->super_ConfigRuleSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_ConfigRuleSyntax).super_SyntaxNode.parent;
  (pIVar13->super_ConfigRuleSyntax).super_SyntaxNode.kind =
       (args->super_ConfigRuleSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar13->super_ConfigRuleSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pIVar13->super_ConfigRuleSyntax).super_SyntaxNode.parent = pSVar1;
  uVar6 = (args->instance).field_0x2;
  NVar7.raw = (args->instance).numFlags.raw;
  uVar8 = (args->instance).rawLen;
  pIVar2 = (args->instance).info;
  TVar9 = (args->topModule).kind;
  uVar10 = (args->topModule).field_0x2;
  NVar11.raw = (args->topModule).numFlags.raw;
  uVar12 = (args->topModule).rawLen;
  pIVar3 = (args->topModule).info;
  (pIVar13->instance).kind = (args->instance).kind;
  (pIVar13->instance).field_0x2 = uVar6;
  (pIVar13->instance).numFlags = (NumericTokenFlags)NVar7.raw;
  (pIVar13->instance).rawLen = uVar8;
  (pIVar13->instance).info = pIVar2;
  (pIVar13->topModule).kind = TVar9;
  (pIVar13->topModule).field_0x2 = uVar10;
  (pIVar13->topModule).numFlags = (NumericTokenFlags)NVar11.raw;
  (pIVar13->topModule).rawLen = uVar12;
  (pIVar13->topModule).info = pIVar3;
  (pIVar13->instanceNames).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->instanceNames).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->instanceNames).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->instanceNames).super_SyntaxListBase.super_SyntaxNode.parent;
  (pIVar13->instanceNames).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->instanceNames).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pIVar13->instanceNames).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pIVar13->instanceNames).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pIVar13->instanceNames).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_006dc458;
  (pIVar13->instanceNames).super_SyntaxListBase.childCount =
       (args->instanceNames).super_SyntaxListBase.childCount;
  sVar4 = (args->instanceNames).
          super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  (pIVar13->instanceNames).
  super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->instanceNames).
       super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>._M_ptr;
  (pIVar13->instanceNames).
  super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar4;
  (pIVar13->instanceNames).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_006dd158;
  TVar9 = (args->semi).kind;
  uVar6 = (args->semi).field_0x2;
  NVar7.raw = (args->semi).numFlags.raw;
  uVar8 = (args->semi).rawLen;
  (pIVar13->ruleClause).ptr = (args->ruleClause).ptr;
  (pIVar13->semi).kind = TVar9;
  (pIVar13->semi).field_0x2 = uVar6;
  (pIVar13->semi).numFlags = (NumericTokenFlags)NVar7.raw;
  (pIVar13->semi).rawLen = uVar8;
  (pIVar13->semi).info = (args->semi).info;
  return pIVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }